

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_common.hpp
# Opt level: O1

string * __thiscall
spirv_cross::
join<char_const(&)[8],std::__cxx11::string,char_const(&)[2],std::__cxx11::string_const&,char_const(&)[3],std::__cxx11::string_const&,char_const(&)[4],std::__cxx11::string&,char_const(&)[3],std::__cxx11::string,char_const(&)[4],std::__cxx11::string,char_const(&)[28],std::__cxx11::string,char_const(&)[4],std::__cxx11::string,char_const(&)[3]>
          (string *__return_storage_ptr__,spirv_cross *this,char (*ts) [8],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_1,char (*ts_2) [2],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_3,char (*ts_4) [3],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_5,char (*ts_6) [4],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_7,char (*ts_8) [3],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_9,char (*ts_10) [4],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_11,
          char (*ts_12) [28],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_13,char (*ts_14) [4]
          ,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_15,
          char (*ts_16) [3])

{
  StringStream<4096UL,_4096UL> stream;
  undefined1 local_1128 [4344];
  
  local_1128._4120_8_ = local_1128 + 0x1030;
  local_1128._0_8_ = (char *)0x0;
  local_1128._8_8_ = 0;
  local_1128._16_8_ = 0;
  local_1128._4128_8_ = 0;
  local_1128._4136_8_ = 8;
  StringStream<4096UL,_4096UL>::reset((StringStream<4096UL,_4096UL> *)local_1128);
  inner::
  join_helper<char_const(&)[8],std::__cxx11::string,char_const(&)[2],std::__cxx11::string_const&,char_const(&)[3],std::__cxx11::string_const&,char_const(&)[4],std::__cxx11::string&,char_const(&)[3],std::__cxx11::string,char_const(&)[4],std::__cxx11::string,char_const(&)[28],std::__cxx11::string,char_const(&)[4],std::__cxx11::string,char_const(&)[3]>
            ((StringStream<4096UL,_4096UL> *)local_1128,(char (*) [8])this,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ts,
             (char (*) [2])ts_1,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ts_2,
             (char (*) [3])ts_3,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ts_4,
             (char (*) [4])ts_5,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ts_6,
             (char (*) [3])ts_7,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ts_8,
             (char (*) [4])ts_9,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ts_10,
             (char (*) [28])ts_11,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ts_12,
             (char (*) [4])ts_13,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ts_14,
             (char (*) [3])ts_15);
  StringStream<4096ul,4096ul>::str_abi_cxx11_(__return_storage_ptr__,local_1128);
  StringStream<4096UL,_4096UL>::~StringStream((StringStream<4096UL,_4096UL> *)local_1128);
  return __return_storage_ptr__;
}

Assistant:

std::string join(Ts &&... ts)
{
	StringStream<> stream;
	inner::join_helper(stream, std::forward<Ts>(ts)...);
	return stream.str();
}